

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

int Sdb_StoDiffExactlyOne3(Vec_Wec_t *vCuts,int Limit,int *pCut,int *pCount)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((long)vCuts->nSize < 1) {
    iVar5 = 0;
    iVar2 = -1;
  }
  else {
    iVar2 = -1;
    uVar7 = 0;
    iVar5 = 0;
    do {
      if (uVar7 == (uint)Limit) break;
      if (0 < *pCut) {
        uVar1 = vCuts->pArray[uVar7].nSize;
        uVar8 = (ulong)(uint)*pCut + 1;
        uVar9 = 1;
        iVar3 = -1;
        do {
          if (0 < (int)uVar1) {
            uVar6 = 0;
            do {
              iVar4 = iVar3;
              if (vCuts->pArray[uVar7].pArray[uVar6] == pCut[uVar9]) goto LAB_0068b3a0;
              uVar6 = uVar6 + 1;
            } while (uVar1 != uVar6);
          }
          iVar4 = pCut[uVar9];
          if (iVar3 != -1) goto LAB_0068b3af;
LAB_0068b3a0:
          uVar9 = uVar9 + 1;
          iVar3 = iVar4;
        } while (uVar9 != uVar8);
        uVar9 = uVar8 & 0xffffffff;
LAB_0068b3af:
        if (((int)uVar9 == (int)uVar8) && (iVar3 != -1)) {
          if (iVar2 == -1) {
            iVar2 = iVar3;
          }
          iVar5 = iVar5 + (uint)(iVar2 == iVar3);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != (long)vCuts->nSize);
  }
  *pCount = iVar5;
  return iVar2;
}

Assistant:

int Sdb_StoDiffExactlyOne3( Vec_Wec_t * vCuts, int Limit, int * pCut, int * pCount )
{
    Vec_Int_t * vCut;  
    int i, iNewAll = -1, Count = 0;
    Vec_WecForEachLevel( vCuts, vCut, i )
    {
        int k, iNew = -1;
        if ( i == Limit )
            break;
        for ( k = 1; k <= pCut[0]; k++ )
        {
            if ( Vec_IntFind(vCut, pCut[k]) >= 0 )
                continue;
            if ( iNew == -1 )
                iNew = pCut[k];
            else 
                break;
        }
        if ( k == pCut[0] + 1 && iNew != -1 )
        {
            if ( iNewAll == -1 )
                iNewAll = iNew;
            if ( iNewAll == iNew )
                Count++;
        }
    }
    *pCount = Count;
    return iNewAll;
}